

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heter_queue.h
# Opt level: O3

void __thiscall
density::
sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
::clear(sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>
        *this)

{
  bool bVar1;
  consume_operation consume;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  local_28 = 0;
  uStack_20 = 0;
  local_18 = 0;
  bVar1 = consume_operation::start_consume_impl
                    ((consume_operation *)&local_28,0,
                     (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                      *)this);
  if (bVar1) {
    do {
      consume_operation::commit((consume_operation *)&local_28);
      bVar1 = consume_operation::start_consume_impl
                        ((consume_operation *)&local_28,0,
                         (conc_heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<65536UL>_>
                          *)this);
    } while (bVar1);
  }
  consume_operation::~consume_operation((consume_operation *)&local_28);
  return;
}

Assistant:

void clear() noexcept
        {
            consume_operation consume;
            while (try_start_consume(consume))
            {
                consume.commit();
            }
        }